

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O1

int testEncoding(int param_1,char **param_2)

{
  char *__s;
  _Alloc_hider _Var1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  wchar_t *pwVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *cstr_00;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  wchar_t *extraout_RDX_05;
  wchar_t *extraout_RDX_06;
  wchar_t *extraout_RDX_07;
  wchar_t *extraout_RDX_08;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uchar (*__s_00) [32];
  int i;
  string str;
  wstring wstr;
  char cstr [2];
  wstring local_b8;
  wstring local_98;
  uint local_74;
  string local_70;
  uint local_4c;
  char *local_48 [2];
  char **local_38;
  
  pcVar3 = setlocale(6,"");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "Locale: None";
    sVar4 = 0xc;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Locale: ",8);
    sVar4 = strlen(pcVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  local_74 = 0;
  lVar9 = 8;
  __s_00 = helloWorldStrings;
  do {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    sVar4 = strlen((char *)__s_00);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,__s_00,*__s_00 + sVar4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_b8._M_dataplus._M_p,
                        local_b8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    cmsys::Encoding::ToWide(&local_98,(string *)&local_b8);
    cmsys::Encoding::ToNarrow(&local_70,&local_98);
    pwVar6 = cmsysEncoding_DupToWide((char *)local_b8._M_dataplus._M_p);
    pcVar3 = cmsysEncoding_DupToNarrow(pwVar6);
    if (local_98._M_string_length != 0) {
      if (local_b8._M_string_length == local_70._M_string_length) {
        if (local_b8._M_string_length != 0) {
          iVar2 = bcmp(local_b8._M_dataplus._M_p,local_70._M_dataplus._M_p,local_b8._M_string_length
                      );
          if (iVar2 != 0) goto LAB_00120cad;
        }
        iVar2 = strcmp(pcVar3,(char *)local_b8._M_dataplus._M_p);
        if (iVar2 == 0) goto LAB_00120d70;
      }
LAB_00120cad:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"converted string was different: ",0x20);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"converted string was different: ",0x20);
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14a430);
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      local_74 = local_74 + 1;
    }
LAB_00120d70:
    free(pwVar6);
    free(pcVar3);
    pcVar3 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      pcVar3 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
      pcVar3 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      pcVar3 = extraout_RDX_02;
    }
    __s_00 = __s_00 + 1;
    lVar9 = lVar9 + -1;
    if (lVar9 == 0) {
      local_48[0] = (char *)CONCAT62(local_48[0]._2_6_,0xff);
      cmsys::Encoding::ToWide_abi_cxx11_(&local_b8,(Encoding *)local_48,pcVar3);
      cmsys::Encoding::ToWide_abi_cxx11_(&local_98,(Encoding *)0x0,cstr_00);
      std::__cxx11::wstring::operator=((wstring *)&local_b8,(wstring *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
      }
      iVar2 = std::__cxx11::wstring::compare((wchar_t *)&local_b8);
      _Var1._M_p = local_b8._M_dataplus._M_p;
      if (iVar2 == 0) {
        uVar8 = 0;
        pcVar3 = extraout_RDX_03;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ToWide(NULL) returned",0x15);
        if (local_b8._M_string_length != 0) {
          uVar10 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)&std::cout,_Var1._M_p[uVar10]);
            uVar10 = uVar10 + 1;
          } while (uVar10 < local_b8._M_string_length);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        uVar8 = 1;
        std::ostream::flush();
        pcVar3 = extraout_RDX_04;
      }
      cmsys::Encoding::ToWide_abi_cxx11_(&local_98,(Encoding *)"",pcVar3);
      std::__cxx11::wstring::operator=((wstring *)&local_b8,(wstring *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity * 4 + 4);
      }
      iVar2 = std::__cxx11::wstring::compare((wchar_t *)&local_b8);
      _Var1._M_p = local_b8._M_dataplus._M_p;
      pwVar6 = extraout_RDX_05;
      if (iVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ToWide(\"\") returned",0x13);
        if (local_b8._M_string_length != 0) {
          uVar10 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
            std::ostream::operator<<((ostream *)&std::cout,_Var1._M_p[uVar10]);
            uVar10 = uVar10 + 1;
          } while (uVar10 < local_b8._M_string_length);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
        std::ostream::put('0');
        std::ostream::flush();
        uVar8 = uVar8 + 1;
        pwVar6 = extraout_RDX_06;
      }
      cmsys::Encoding::ToNarrow_abi_cxx11_((string *)&local_98,(Encoding *)0x0,pwVar6);
      iVar2 = std::__cxx11::string::compare((char *)&local_98);
      pwVar6 = extraout_RDX_07;
      if (iVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ToNarrow(NULL) returned ",0x18);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_98._M_dataplus._M_p,
                            local_98._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        uVar8 = uVar8 + 1;
        pwVar6 = extraout_RDX_08;
      }
      cmsys::Encoding::ToNarrow_abi_cxx11_(&local_70,(Encoding *)L"",pwVar6);
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      iVar2 = std::__cxx11::wstring::compare((wchar_t *)&local_b8);
      if (iVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ToNarrow(\"\") returned ",0x16);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_98._M_dataplus._M_p,
                            local_98._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        uVar8 = uVar8 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity * 4 + 4);
      }
      local_48[0] = "./app.exe";
      local_48[1] = (char *)0x13c1a0;
      cmsys::Encoding::CommandLineArguments::CommandLineArguments
                ((CommandLineArguments *)&local_b8,2,local_48);
      cmsys::Encoding::CommandLineArguments::CommandLineArguments
                ((CommandLineArguments *)&local_98,(CommandLineArguments *)&local_b8);
      local_4c = uVar8;
      local_38 = cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)&local_b8);
      lVar9 = 0;
      uVar8 = 0;
      while( true ) {
        iVar2 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)&local_b8);
        if (iVar2 <= lVar9) break;
        pcVar3 = local_38[lVar9];
        iVar2 = strcmp(local_48[lVar9],pcVar3);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"argv[",5);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
          __s = local_48[lVar9];
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar4 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar3,sVar4);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          uVar8 = uVar8 + 1;
        }
        lVar9 = lVar9 + 1;
      }
      cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)&local_70,2,local_48);
      uVar7 = local_4c | local_74;
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments
                ((CommandLineArguments *)&local_70);
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments
                ((CommandLineArguments *)&local_98);
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments
                ((CommandLineArguments *)&local_b8);
      return uVar7 | uVar8;
    }
  } while( true );
}

Assistant:

int testEncoding(int, char*[])
{
  const char* loc = setlocale(LC_ALL, "");
  if(loc)
    {
    std::cout << "Locale: " << loc << std::endl;
    }
  else
    {
    std::cout << "Locale: None" << std::endl;
    }

  int ret = 0;

  ret |= testHelloWorldEncoding();
  ret |= testRobustEncoding();
  ret |= testCommandLineArguments();

  return ret;
}